

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_extension.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ExtensionGenerator::GenerateDefinition
          (ExtensionGenerator *this,Printer *printer)

{
  bool bVar1;
  CppType CVar2;
  Descriptor *pDVar3;
  FileDescriptor *this_00;
  string *psVar4;
  mapped_type *s;
  undefined1 qualified;
  Options *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  bool local_1fa;
  allocator local_1f9;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  key_type local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_70 [8];
  string default_str;
  Formatter format;
  Printer *printer_local;
  ExtensionGenerator *this_local;
  
  if (((this->options_).lite_implicit_weak_fields & 1U) != 0) {
    pDVar3 = FieldDescriptor::containing_type(this->descriptor_);
    this_00 = Descriptor::file(pDVar3);
    psVar4 = FileDescriptor::name_abi_cxx11_(this_00);
    bVar1 = std::operator==(psVar4,"net/proto2/proto/descriptor.proto");
    if (bVar1) {
      return;
    }
  }
  Formatter::Formatter((Formatter *)((long)&default_str.field_2 + 8),printer,&this->variables_);
  std::__cxx11::string::string((string *)local_70);
  CVar2 = FieldDescriptor::cpp_type(this->descriptor_);
  if (CVar2 == CPPTYPE_STRING) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_e0,"scoped_name",&local_e1);
    s = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&this->variables_,&local_e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,"::",&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_130,"_",&local_131);
    psVar4 = &local_130;
    StringReplace(&local_c0,s,&local_108,psVar4,true);
    std::operator+(&local_a0,&local_c0,"_default");
    std::__cxx11::string::operator=((string *)local_70,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    DefaultValue_abi_cxx11_
              (&local_158,(cpp *)&this->options_,(Options *)this->descriptor_,
               (FieldDescriptor *)psVar4);
    args_1 = &local_158;
    Formatter::operator()
              ((Formatter *)((long)&default_str.field_2 + 8),"const std::string $1$($2$);\n",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,args_1)
    ;
    qualified = SUB81(args_1,0);
    std::__cxx11::string::~string((string *)&local_158);
  }
  else {
    pDVar3 = FieldDescriptor::message_type(this->descriptor_);
    if (pDVar3 == (Descriptor *)0x0) {
      DefaultValue_abi_cxx11_
                (&local_1b8,(cpp *)&this->options_,(Options *)this->descriptor_,
                 (FieldDescriptor *)in_RCX);
      qualified = SUB81(in_RCX,0);
      std::__cxx11::string::operator=((string *)local_70,(string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
    }
    else {
      FieldMessageTypeName_abi_cxx11_
                (&local_198,(cpp *)this->descriptor_,(FieldDescriptor *)&this->options_,in_RCX);
      qualified = SUB81(in_RCX,0);
      std::operator+(&local_178,&local_198,"::default_instance()");
      std::__cxx11::string::operator=((string *)local_70,(string *)&local_178);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_198);
    }
  }
  bVar1 = IsScoped(this);
  if (bVar1) {
    Formatter::operator()<>
              ((Formatter *)((long)&default_str.field_2 + 8),
               "#if !defined(_MSC_VER) || (_MSC_VER >= 1900 && _MSC_VER < 1912)\nconst int $scope$$constant_name$;\n#endif\n"
              );
  }
  Formatter::operator()
            ((Formatter *)((long)&default_str.field_2 + 8),
             "PROTOBUF_ATTRIBUTE_INIT_PRIORITY ::$proto_ns$::internal::ExtensionIdentifier< $extendee$,\n    ::$proto_ns$::internal::$type_traits$, $field_type$, $packed$ >\n  $scoped_name$($constant_name$, $1$);\n"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  CVar2 = FieldDescriptor::cpp_type(this->descriptor_);
  if (CVar2 == CPPTYPE_MESSAGE) {
    pDVar3 = FieldDescriptor::message_type(this->descriptor_);
    bVar1 = ShouldVerify(pDVar3,&this->options_,this->scc_analyzer_);
    if (bVar1) {
      pDVar3 = FieldDescriptor::containing_type(this->descriptor_);
      bVar1 = ShouldVerify(pDVar3,&this->options_,this->scc_analyzer_);
      if (bVar1) {
        pDVar3 = FieldDescriptor::message_type(this->descriptor_);
        ClassName_abi_cxx11_(&local_1d8,(cpp *)pDVar3,(Descriptor *)0x1,(bool)qualified);
        local_1fa = IsScoped(this);
        if (local_1fa) {
          pDVar3 = FieldDescriptor::extension_scope(this->descriptor_);
          ClassName_abi_cxx11_(&local_1f8,(cpp *)pDVar3,(Descriptor *)0x0,(bool)qualified);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1f8,"",&local_1f9);
        }
        local_1fa = !local_1fa;
        Formatter::operator()
                  ((Formatter *)((long)&default_str.field_2 + 8),
                   "PROTOBUF_ATTRIBUTE_INIT_PRIORITY ::$proto_ns$::internal::RegisterExtensionVerify< $extendee$,\n    $1$, $number$> $2$_$name$_register;\n"
                   ,&local_1d8,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        if (local_1fa) {
          std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
        }
        std::__cxx11::string::~string((string *)&local_1d8);
      }
    }
  }
  std::__cxx11::string::~string((string *)local_70);
  Formatter::~Formatter((Formatter *)((long)&default_str.field_2 + 8));
  return;
}

Assistant:

void ExtensionGenerator::GenerateDefinition(io::Printer* printer) {
  // If we are building for lite with implicit weak fields, we want to skip over
  // any custom options (i.e. extensions of messages from descriptor.proto).
  // This prevents the creation of any unnecessary linker references to the
  // descriptor messages.
  if (options_.lite_implicit_weak_fields &&
      descriptor_->containing_type()->file()->name() ==
          "net/proto2/proto/descriptor.proto") {
    return;
  }

  Formatter format(printer, variables_);
  std::string default_str;
  // If this is a class member, it needs to be declared in its class scope.
  if (descriptor_->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
    // We need to declare a global string which will contain the default value.
    // We cannot declare it at class scope because that would require exposing
    // it in the header which would be annoying for other reasons.  So we
    // replace :: with _ in the name and declare it as a global.
    default_str =
        StringReplace(variables_["scoped_name"], "::", "_", true) + "_default";
    format("const std::string $1$($2$);\n", default_str,
           DefaultValue(options_, descriptor_));
  } else if (descriptor_->message_type()) {
    // We have to initialize the default instance for extensions at registration
    // time.
    default_str =
        FieldMessageTypeName(descriptor_, options_) + "::default_instance()";
  } else {
    default_str = DefaultValue(options_, descriptor_);
  }

  // Likewise, class members need to declare the field constant variable.
  if (IsScoped()) {
    format(
        "#if !defined(_MSC_VER) || (_MSC_VER >= 1900 && _MSC_VER < 1912)\n"
        "const int $scope$$constant_name$;\n"
        "#endif\n");
  }

  format(
      "PROTOBUF_ATTRIBUTE_INIT_PRIORITY "
      "::$proto_ns$::internal::ExtensionIdentifier< $extendee$,\n"
      "    ::$proto_ns$::internal::$type_traits$, $field_type$, $packed$ >\n"
      "  $scoped_name$($constant_name$, $1$);\n",
      default_str);

  // Register extension verify function if needed.
  if (descriptor_->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      ShouldVerify(descriptor_->message_type(), options_, scc_analyzer_) &&
      ShouldVerify(descriptor_->containing_type(), options_, scc_analyzer_)) {
    format(
        "PROTOBUF_ATTRIBUTE_INIT_PRIORITY "
        "::$proto_ns$::internal::RegisterExtensionVerify< $extendee$,\n"
        "    $1$, $number$> $2$_$name$_register;\n",
        ClassName(descriptor_->message_type(), true),
        IsScoped() ? ClassName(descriptor_->extension_scope(), false) : "");
  }
}